

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_Fad<double>_>
::dx(FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_Fad<double>_>
     *this,int i)

{
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *pFVar1;
  Fad<double> *pFVar2;
  Fad<double> *pFVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  
  pFVar1 = (this->left_->fadexpr_).right_;
  pFVar2 = (pFVar1->fadexpr_).left_;
  pFVar3 = (pFVar1->fadexpr_).right_;
  pdVar6 = &pFVar2->defaultVal;
  if ((pFVar2->dx_).num_elts != 0) {
    pdVar6 = (pFVar2->dx_).ptr_to_data + i;
  }
  pdVar5 = &pFVar3->defaultVal;
  if ((pFVar3->dx_).num_elts != 0) {
    pdVar5 = (pFVar3->dx_).ptr_to_data + i;
  }
  pFVar2 = this->right_;
  pdVar4 = &pFVar2->defaultVal;
  if ((pFVar2->dx_).num_elts != 0) {
    pdVar4 = (pFVar2->dx_).ptr_to_data + i;
  }
  return (*pdVar6 + *pdVar5) * (this->left_->fadexpr_).left_.constant_ + *pdVar4;
}

Assistant:

const value_type dx(int i) const {return left_.dx(i) + right_.dx(i);}